

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate1.hpp
# Opt level: O2

void __thiscall
qclab::qgates::QRotationGate1<std::complex<float>_>::QRotationGate1
          (QRotationGate1<std::complex<float>_> *this,int qubit,rotation_type *rot,bool fixed)

{
  QGate1<std::complex<float>_>::QGate1(&this->super_QGate1<std::complex<float>_>,qubit);
  (this->super_QGate1<std::complex<float>_>).field_0xc = fixed;
  (this->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00135ef8;
  (this->rotation_).angle_ = rot->angle_;
  return;
}

Assistant:

QRotationGate1( const int qubit , const rotation_type& rot ,
                        const bool fixed = false )
        : QGate1< T >( qubit )
        , rotation_( rot )
        , QAdjustable( fixed )
        { }